

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsConnection.cpp
# Opt level: O2

SharedDispatcher __thiscall
AmsConnection::CreateNotifyMapping
          (AmsConnection *this,uint32_t hNotify,shared_ptr<Notification> *notification)

{
  NotificationDispatcher *this_00;
  __shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  SharedDispatcher SVar1;
  __shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  DispatcherListAdd(this,(VirtualConnection *)CONCAT44(in_register_00000034,hNotify));
  *(uint32_t *)
   ((in_RCX->_M_ptr->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start + 8) = (uint32_t)notification;
  this_00 = (NotificationDispatcher *)this->router;
  std::__shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&_Stack_38,in_RCX);
  NotificationDispatcher::Emplace
            (this_00,(uint32_t)notification,(shared_ptr<Notification> *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  SVar1.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar1.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedDispatcher)
         SVar1.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedDispatcher AmsConnection::CreateNotifyMapping(uint32_t hNotify, std::shared_ptr<Notification> notification)
{
    auto dispatcher = DispatcherListAdd(notification->connection);
    notification->hNotify(hNotify);
    dispatcher->Emplace(hNotify, notification);
    return dispatcher;
}